

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alBufferi(void)

{
  uint32 name_00;
  ALenum param_00;
  int32 value_00;
  ALint value;
  ALenum param;
  ALuint name;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&param);
  if (io_failure == 0) {
    name_00 = IO_UINT32();
    param_00 = IO_ENUM();
    value_00 = IO_INT32();
    if (io_failure == 0) {
      visit_alBufferi((CallerInfo *)&param,name_00,param_00,value_00);
    }
  }
  return;
}

Assistant:

static void decode_alBufferi(void)
{
    IO_START(alBufferi);
    const ALuint name = IO_UINT32();
    const ALenum param = IO_ENUM();
    const ALint value = IO_INT32();
    if (!io_failure) visit_alBufferi(&callerinfo, name, param, value);
    IO_END();
}